

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O1

ON_SimpleArray<double> * __thiscall
ON_SimpleArray<double>::operator=(ON_SimpleArray<double> *this,ON_SimpleArray<double> *src)

{
  int iVar1;
  
  if (this != src) {
    iVar1 = src->m_count;
    if ((long)iVar1 < 1) {
      this->m_count = 0;
    }
    else {
      if (this->m_capacity < iVar1) {
        SetCapacity(this,(long)iVar1);
      }
      if (this->m_a != (double *)0x0) {
        iVar1 = src->m_count;
        this->m_count = iVar1;
        memcpy(this->m_a,src->m_a,(long)iVar1 << 3);
      }
    }
  }
  return this;
}

Assistant:

ON_SimpleArray<T>& ON_SimpleArray<T>::operator=( const ON_SimpleArray<T>& src )
{
  if( this != &src ) {
    if ( src.m_count <= 0 ) {
      m_count = 0;
    }
    else {
      if ( m_capacity < src.m_count ) {
        SetCapacity( src.m_count );
      }
      if ( m_a ) {
        m_count = src.m_count;
        memcpy( (void*)(m_a), (void*)(src.m_a), m_count*sizeof(T) );
      }
    }
  }  
  return *this;
}